

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_write_hIST(png_structrp png_ptr,png_const_uint_16p hist,int num_hist)

{
  ulong uVar1;
  png_byte buf [3];
  ushort local_2b;
  
  if ((int)(uint)png_ptr->num_palette < num_hist) {
    png_warning(png_ptr,"Invalid number of histogram entries specified");
    return;
  }
  png_write_chunk_header(png_ptr,0x68495354,num_hist * 2);
  if (0 < num_hist) {
    uVar1 = 0;
    do {
      local_2b = hist[uVar1] << 8 | hist[uVar1] >> 8;
      png_write_chunk_data(png_ptr,(png_const_bytep)&local_2b,2);
      uVar1 = uVar1 + 1;
    } while ((uint)num_hist != uVar1);
  }
  png_write_chunk_end(png_ptr);
  return;
}

Assistant:

void /* PRIVATE */
png_write_hIST(png_structrp png_ptr, png_const_uint_16p hist, int num_hist)
{
   int i;
   png_byte buf[3];

   png_debug(1, "in png_write_hIST");

   if (num_hist > (int)png_ptr->num_palette)
   {
      png_debug2(3, "num_hist = %d, num_palette = %d", num_hist,
          png_ptr->num_palette);

      png_warning(png_ptr, "Invalid number of histogram entries specified");
      return;
   }

   png_write_chunk_header(png_ptr, png_hIST, (png_uint_32)(num_hist * 2));

   for (i = 0; i < num_hist; i++)
   {
      png_save_uint_16(buf, hist[i]);
      png_write_chunk_data(png_ptr, buf, 2);
   }

   png_write_chunk_end(png_ptr);
}